

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DefaultShaderSourceStreamFactory.cpp
# Opt level: O1

void Diligent::CreateDefaultShaderSourceStreamFactory
               (Char *SearchDirectories,
               IShaderSourceInputStreamFactory **ppShaderSourceStreamFactory)

{
  DefaultShaderSourceStreamFactory *this;
  string msg;
  undefined1 local_40 [16];
  undefined1 local_30 [16];
  undefined4 local_20;
  Char *local_18;
  
  local_18 = SearchDirectories;
  if (ppShaderSourceStreamFactory == (IShaderSourceInputStreamFactory **)0x0) {
    FormatString<char[46]>
              ((string *)local_40,(char (*) [46])"ppShaderSourceStreamFactory must not be null.");
    DebugAssertionFailed
              ((Char *)local_40._0_8_,"CreateDefaultShaderSourceStreamFactory",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DefaultShaderSourceStreamFactory.cpp"
               ,0x7e);
    if ((undefined1 *)local_40._0_8_ != local_30) {
      operator_delete((void *)local_40._0_8_,local_30._0_8_ + 1);
    }
  }
  if (*ppShaderSourceStreamFactory != (IShaderSourceInputStreamFactory *)0x0) {
    FormatString<char[95]>
              ((string *)local_40,
               (char (*) [95])
               "*ppShaderSourceStreamFactory is not null. Make sure the pointer is null to avoid memory leaks."
              );
    DebugAssertionFailed
              ((Char *)local_40._0_8_,"CreateDefaultShaderSourceStreamFactory",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DefaultShaderSourceStreamFactory.cpp"
               ,0x7f);
    if ((undefined1 *)local_40._0_8_ != local_30) {
      operator_delete((void *)local_40._0_8_,local_30._0_8_ + 1);
    }
  }
  local_40._0_8_ = GetRawAllocator();
  local_40._8_8_ = 0;
  local_30._0_8_ = "DefaultShaderSourceStreamFactory instance";
  local_30._8_8_ =
       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DefaultShaderSourceStreamFactory.cpp"
  ;
  local_20 = 0x83;
  this = MakeNewRCObj<Diligent::DefaultShaderSourceStreamFactory,Diligent::IMemoryAllocator>::
         operator()((MakeNewRCObj<Diligent::DefaultShaderSourceStreamFactory,Diligent::IMemoryAllocator>
                     *)local_40,&local_18);
  DefaultShaderSourceStreamFactory::QueryInterface
            (this,(INTERFACE_ID *)IID_IShaderSourceInputStreamFactory,
             (IObject **)ppShaderSourceStreamFactory);
  return;
}

Assistant:

void CreateDefaultShaderSourceStreamFactory(const Char*                       SearchDirectories,
                                            IShaderSourceInputStreamFactory** ppShaderSourceStreamFactory)
{
    DEV_CHECK_ERR(ppShaderSourceStreamFactory != nullptr, "ppShaderSourceStreamFactory must not be null.");
    DEV_CHECK_ERR(*ppShaderSourceStreamFactory == nullptr, "*ppShaderSourceStreamFactory is not null. Make sure the pointer is null to avoid memory leaks.");

    auto& Allocator = GetRawAllocator();
    auto* pStreamFactory =
        NEW_RC_OBJ(Allocator, "DefaultShaderSourceStreamFactory instance", DefaultShaderSourceStreamFactory)(SearchDirectories);
    pStreamFactory->QueryInterface(IID_IShaderSourceInputStreamFactory, reinterpret_cast<IObject**>(ppShaderSourceStreamFactory));
}